

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<std::complex<long_double>_>::Decompose_LU(TPZMatrix<std::complex<long_double>_> *this)

{
  long lVar1;
  longdouble lVar2;
  longdouble lVar3;
  longdouble lVar4;
  byte bVar5;
  complex<long_double> *__z;
  int64_t j;
  long lVar6;
  long lVar7;
  long lVar8;
  longdouble in_ST0;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble lVar11;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar12;
  complex<long_double> __r;
  undefined4 local_f8 [2];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  long local_d0;
  complex<long_double> nn;
  complex<long_double> __r_1;
  complex<long_double> pivot;
  complex<long_double> local_58;
  
  bVar5 = (this->super_TPZBaseMatrix).fDecomposed;
  if (1 < bVar5) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
    bVar5 = (this->super_TPZBaseMatrix).fDecomposed;
  }
  if (bVar5 == 0) {
    lVar10 = (longdouble)0;
    nn._M_value._0_4_ = SUB104(lVar10,0);
    nn._M_value._4_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
    nn._M_value._8_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
    pivot._M_value._0_8_ = SUB108(lVar10,0);
    local_d0 = (this->super_TPZBaseMatrix).fRow;
    lVar1 = (this->super_TPZBaseMatrix).fCol;
    if (lVar1 < local_d0) {
      local_d0 = lVar1;
    }
    if (local_d0 < 1) {
      local_d0 = 0;
    }
    lVar1 = 0;
    lVar10 = in_ST5;
    nn._M_value._16_4_ = nn._M_value._0_4_;
    nn._M_value._20_4_ = nn._M_value._4_4_;
    nn._M_value._24_2_ = nn._M_value._8_2_;
    pivot._M_value._8_2_ = nn._M_value._8_2_;
    pivot._M_value._16_8_ = pivot._M_value._0_8_;
    pivot._M_value._24_2_ = nn._M_value._8_2_;
    while (lVar7 = lVar1, lVar7 != local_d0) {
      __z = (complex<long_double> *)this;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (local_f8,this,lVar7,lVar7);
      pivot._M_value._4_4_ = local_f8[1];
      pivot._M_value._0_4_ = local_f8[0];
      pivot._M_value._20_4_ = uStack_e4;
      pivot._M_value._16_4_ = local_e8;
      pivot._M_value._24_2_ = SUB42(uStack_e0,0);
      pivot._M_value._26_6_ = SUB86(CONCAT44(uStack_dc,uStack_e0) >> 0x10,0);
      pivot._M_value._8_2_ = SUB42(uStack_f0,0);
      pivot._M_value._10_6_ = SUB86(CONCAT44(uStack_ec,uStack_f0) >> 0x10,0);
      __r._M_value._16_4_ = local_e8;
      __r._M_value._20_4_ = uStack_e4;
      __r._M_value._26_2_ = SUB42((uint)uStack_e0 >> 0x10,0);
      __r._M_value._28_4_ = uStack_dc;
      __r._M_value._0_4_ = local_f8[0];
      __r._M_value._4_4_ = local_f8[1];
      __r._M_value._10_2_ = SUB42((uint)uStack_f0 >> 0x10,0);
      __r._M_value._12_4_ = uStack_ec;
      __r._M_value._8_2_ = pivot._M_value._8_2_;
      __r._M_value._24_2_ = pivot._M_value._24_2_;
      std::abs<long_double>((longdouble *)&__r,__z);
      lVar9 = ABS(in_ST0);
      in_ST0 = in_ST1;
      lVar11 = in_ST2;
      lVar2 = in_ST3;
      lVar3 = in_ST4;
      lVar4 = in_ST5;
      lVar12 = lVar10;
      if (lVar9 < (longdouble)1e-16) {
        Error("Decompose_LU <matrix is singular>",(char *)0x0);
        in_ST0 = in_ST1;
        lVar11 = in_ST2;
        lVar2 = in_ST3;
        lVar3 = in_ST4;
        lVar4 = in_ST5;
        lVar12 = lVar10;
        lVar10 = lVar12;
      }
      in_ST5 = lVar12;
      in_ST4 = lVar4;
      in_ST3 = lVar3;
      in_ST2 = lVar2;
      in_ST1 = lVar11;
      lVar1 = lVar7 + 1;
      for (lVar8 = lVar1; lVar8 < (this->super_TPZBaseMatrix).fRow; lVar8 = lVar8 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (local_f8,this,lVar8,lVar7);
        __r._M_value._16_4_ = local_e8;
        __r._M_value._20_4_ = uStack_e4;
        __r._M_value._24_2_ = SUB42(uStack_e0,0);
        __r._M_value._26_2_ = SUB42((uint)uStack_e0 >> 0x10,0);
        __r._M_value._28_4_ = uStack_dc;
        __r._M_value._0_4_ = local_f8[0];
        __r._M_value._4_4_ = local_f8[1];
        __r._M_value._8_2_ = SUB42(uStack_f0,0);
        __r._M_value._10_2_ = SUB42((uint)uStack_f0 >> 0x10,0);
        __r._M_value._12_4_ = uStack_ec;
        std::complex<long_double>::operator/=(&__r,&pivot);
        nn._M_value._0_4_ = __r._M_value._0_4_;
        nn._M_value._4_4_ = __r._M_value._4_4_;
        nn._M_value._8_2_ = __r._M_value._8_2_;
        nn._M_value._10_2_ = __r._M_value._10_2_;
        nn._M_value._12_4_ = __r._M_value._12_4_;
        nn._M_value._16_4_ = __r._M_value._16_4_;
        nn._M_value._20_4_ = __r._M_value._20_4_;
        nn._M_value._24_2_ = __r._M_value._24_2_;
        nn._M_value._26_2_ = __r._M_value._26_2_;
        nn._M_value._28_4_ = __r._M_value._28_4_;
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])(this,lVar8,lVar7,&nn)
        ;
        for (lVar6 = lVar1; lVar6 < (this->super_TPZBaseMatrix).fCol; lVar6 = lVar6 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (local_f8,this,lVar8,lVar6);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,lVar7,lVar6);
          __r_1._M_value._4_4_ = nn._M_value._4_4_;
          __r_1._M_value._0_4_ = nn._M_value._0_4_;
          __r_1._M_value._20_4_ = nn._M_value._20_4_;
          __r_1._M_value._16_4_ = nn._M_value._16_4_;
          __r_1._M_value._24_2_ = nn._M_value._24_2_;
          __r_1._M_value._26_6_ =
               SUB86(CONCAT44(nn._M_value._28_4_,CONCAT22(nn._M_value._26_2_,nn._M_value._24_2_)) >>
                     0x10,0);
          __r_1._M_value._8_2_ = nn._M_value._8_2_;
          __r_1._M_value._10_6_ =
               SUB86(CONCAT44(nn._M_value._12_4_,CONCAT22(nn._M_value._10_2_,nn._M_value._8_2_)) >>
                     0x10,0);
          std::complex<long_double>::operator*=(&__r_1,&local_58);
          __r._M_value._8_2_ = SUB42(uStack_f0,0);
          __r._M_value._10_2_ = SUB42((uint)uStack_f0 >> 0x10,0);
          __r._M_value._12_4_ = uStack_ec;
          __r._M_value._24_2_ = SUB42(uStack_e0,0);
          __r._M_value._26_2_ = SUB42((uint)uStack_e0 >> 0x10,0);
          __r._M_value._28_4_ = uStack_dc;
          lVar11 = (longdouble)CONCAT28(__r._M_value._8_2_,CONCAT44(local_f8[1],local_f8[0])) -
                   (longdouble)CONCAT28(__r_1._M_value._8_2_,__r_1._M_value._0_8_);
          lVar10 = (longdouble)CONCAT28(__r._M_value._24_2_,CONCAT44(uStack_e4,local_e8)) -
                   (longdouble)CONCAT28(__r_1._M_value._24_2_,__r_1._M_value._16_8_);
          __r._M_value._0_4_ = SUB104(lVar11,0);
          __r._M_value._4_4_ = SUB104((unkuint10)lVar11 >> 0x20,0);
          __r._M_value._8_2_ = SUB102((unkuint10)lVar11 >> 0x40,0);
          __r._M_value._16_4_ = SUB104(lVar10,0);
          __r._M_value._20_4_ = SUB104((unkuint10)lVar10 >> 0x20,0);
          __r._M_value._24_2_ = SUB102((unkuint10)lVar10 >> 0x40,0);
          in_ST5 = in_ST4;
          lVar10 = in_ST4;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar8,lVar6,&__r);
        }
      }
    }
    (this->super_TPZBaseMatrix).fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::Decompose_LU() {
	
	if (  fDecomposed && fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
	if (fDecomposed) return 1;
	
	TVar nn, pivot;
	int64_t  min = ( Cols() < (Rows()) ) ? Cols() : Rows();
	
	for ( int64_t k = 0; k < min ; k++ ) {
		if (IsZero( pivot = GetVal(k, k))) Error( "Decompose_LU <matrix is singular>" );
		for ( int64_t i = k+1; i < Rows(); i++ ) {
			nn = GetVal( i, k ) / pivot;
			PutVal( i, k, nn );
			for ( int64_t j = k+1; j < Cols(); j++ ) PutVal(i,j,GetVal(i,j)-nn*GetVal(k,j));
		}
	}
	fDecomposed=ELU;
	return 1;
}